

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::SingleVertexArrayNormalizeGroup::init
          (SingleVertexArrayNormalizeGroup *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  undefined4 componentCount_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar2;
  GLValue GVar3;
  undefined1 local_158 [8];
  Spec spec;
  undefined4 uStack_11c;
  undefined1 local_110 [8];
  ArraySpec arraySpec;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string name;
  int countNdx;
  int componentCount;
  int counts [2];
  SingleVertexArrayNormalizeGroup *this_local;
  
  _countNdx = 0x10000000001;
  name.field_2._12_4_ = 2;
  counts = (int  [2])this;
  iVar1 = 1;
  while ((int)name.field_2._12_4_ < 5) {
    for (name.field_2._8_4_ = 0; (int)name.field_2._8_4_ < 2;
        name.field_2._8_4_ = name.field_2._8_4_ + 1) {
      if (((this->m_type != INPUTTYPE_UNSIGNED_INT_2_10_10_10) &&
          (this->m_type != INPUTTYPE_INT_2_10_10_10)) || (name.field_2._12_4_ == 4)) {
        typeToString<int>(&local_a0,name.field_2._12_4_);
        std::operator+(&local_80,"components",&local_a0);
        std::operator+(&local_60,&local_80,"_quads");
        typeToString<int>((string *)&arraySpec.max.field_1.fl,(&countNdx)[(int)name.field_2._8_4_]);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                       ,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&arraySpec.max.field_1.fl);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        componentCount_ = name.field_2._12_4_;
        type = this->m_type;
        GVar2 = deqp::gls::GLValue::getMinValue(type);
        GVar3 = deqp::gls::GLValue::getMaxValue(this->m_type);
        spec.arrays.
        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
        max_._4_4_ = spec.arrays.
                     super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        max_.type = (InputType)
                    spec.arrays.
                    super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        min_._4_4_ = uStack_11c;
        min_.type = GVar2.type;
        min_.field_1 = GVar2.field_1;
        max_.field_1 = GVar3.field_1;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_110,type,OUTPUTTYPE_VEC4,STORAGE_USER,USAGE_DYNAMIC_DRAW,
                   componentCount_,0,0,true,min_,max_);
        deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_158);
        local_158._0_4_ = PRIMITIVE_TRIANGLES;
        local_158._4_4_ = (&countNdx)[(int)name.field_2._8_4_];
        spec.primitive = PRIMITIVE_POINTS;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
        ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                     *)&spec.first,(value_type *)local_110);
        this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
        testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
        name_00 = (char *)std::__cxx11::string::c_str();
        desc = (char *)std::__cxx11::string::c_str();
        deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                  (this_00,testCtx,renderCtx,(Spec *)local_158,name_00,desc);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_158);
        std::__cxx11::string::~string((string *)local_40);
      }
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
    iVar1 = name.field_2._12_4_;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayNormalizeGroup::init (void)
{
	int					counts[]		= {1, 256};

	for (int componentCount = 2; componentCount < 5; componentCount++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
				continue;

			std::string name = "components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

			MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
															Array::OUTPUTTYPE_VEC4,
															Array::STORAGE_USER,
															Array::USAGE_DYNAMIC_DRAW,
															componentCount,
															0,
															0,
															true,
															GLValue::getMinValue(m_type),
															GLValue::getMaxValue(m_type));

			MultiVertexArrayTest::Spec spec;
			spec.primitive	= Array::PRIMITIVE_TRIANGLES;
			spec.drawCount	= counts[countNdx];
			spec.first		= 0;
			spec.arrays.push_back(arraySpec);

			addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
		}
	}
}